

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_callmsg.c
# Opt level: O0

_Bool xdr_call_decode(XDR *xdrs,rpc_msg *cmsg,int32_t *buf)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint32_t *local_28;
  int32_t *buf_local;
  rpc_msg *cmsg_local;
  XDR *xdrs_local;
  
  if (buf == (int32_t *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_call_decode",0xcb);
    }
    _Var1 = xdr_getuint32(xdrs,(uint32_t *)&cmsg->ru);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rm_call.cb_rpcvers","xdr_call_decode",0xcf);
      }
      return false;
    }
    local_28 = (uint32_t *)0x0;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_call_decode",0xc6);
    }
    local_28 = (uint32_t *)(buf + 1);
    uVar2 = ntohl(*buf);
    (cmsg->ru).RM_cmb.cb_rpcvers = uVar2;
  }
  if ((cmsg->ru).RM_cmb.cb_rpcvers != 2) {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR rm_call.cb_rpcvers %u != %u","xdr_call_decode",0xd6,
                 (ulong)(cmsg->ru).RM_cmb.cb_rpcvers,2);
    }
    return false;
  }
  if (local_28 == (uint32_t *)0x0) {
    _Var1 = xdr_getuint32(xdrs,&cmsg->cb_prog);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR cb_prog","xdr_call_decode",0xe2);
      }
      return false;
    }
    _Var1 = xdr_getuint32(xdrs,&cmsg->cb_vers);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR cb_vers","xdr_call_decode",0xe7);
      }
      return false;
    }
  }
  else {
    uVar2 = ntohl(*local_28);
    cmsg->cb_prog = uVar2;
    uVar2 = ntohl(local_28[1]);
    cmsg->cb_vers = uVar2;
  }
  puVar3 = (uint32_t *)xdr_inline_decode(xdrs,0xc);
  if (puVar3 == (uint32_t *)0x0) {
    _Var1 = xdr_getuint32(xdrs,&cmsg->cb_proc);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR cb_proc","xdr_call_decode",0xf7);
      }
      return false;
    }
    _Var1 = xdr_opaque_auth_decode(xdrs,&cmsg->cb_cred,(int32_t *)0x0);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR (return)","xdr_call_decode",0xfc);
      }
      return false;
    }
  }
  else {
    uVar2 = ntohl(*puVar3);
    cmsg->cb_proc = uVar2;
    _Var1 = xdr_opaque_auth_decode(xdrs,&cmsg->cb_cred,(int32_t *)(puVar3 + 1));
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR (return)","xdr_call_decode",0xf1);
      }
      return false;
    }
  }
  _Var1 = xdr_opaque_auth_decode(xdrs,&cmsg->cb_verf,(int32_t *)0x0);
  if (_Var1) {
    xdrs_local._7_1_ = true;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR (return)","xdr_call_decode",0x103);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

bool
xdr_call_decode(XDR *xdrs, struct rpc_msg *cmsg, int32_t *buf)
{
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		cmsg->rm_call.cb_rpcvers = IXDR_GET_U_INT32(buf);
	} else {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_getuint32(xdrs, &cmsg->rm_call.cb_rpcvers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers",
				__func__, __LINE__);
			return (false);
		}
	}
	if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
			__func__, __LINE__,
			cmsg->rm_call.cb_rpcvers,
			RPC_MSG_VERSION);
		return (false);
	}

	if (buf != NULL) {
		cmsg->cb_prog = IXDR_GET_U_INT32(buf);
		cmsg->cb_vers = IXDR_GET_U_INT32(buf);
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_prog))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_prog",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_vers))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_vers",
			__func__, __LINE__);
		return (false);
	}

	buf = xdr_inline_decode(xdrs, 3 * BYTES_PER_XDR_UNIT);
	if (buf != NULL) {
		cmsg->cb_proc = IXDR_GET_U_INT32(buf);
		if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_cred), buf)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
	} else if (!xdr_getuint32(xdrs, &(cmsg->cb_proc))) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_proc",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_cred), NULL)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR (return)",
			__func__, __LINE__);
		return (false);
	}

	if (!xdr_opaque_auth_decode(xdrs, &(cmsg->cb_verf), NULL)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR (return)",
			__func__, __LINE__);
		return (false);
	}
	return (true);
}